

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O1

void __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::
~ImplicitProducer(ImplicitProducer *this)

{
  ~ImplicitProducer(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

~ImplicitProducer()
        {
            // Note that since we're in the destructor we can assume that all enqueue/dequeue operations
            // completed already; this means that all undequeued elements are placed contiguously across
            // contiguous blocks, and that only the first and last remaining blocks can be only partially
            // empty (all other remaining blocks must be completely full).
            
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
            // Unregister ourselves for thread termination notification
            if (!this->inactive.load(std::memory_order_relaxed)) {
                details::ThreadExitNotifier::unsubscribe(&threadExitListener);
            }
#endif
            
            // Destroy all remaining elements!
            auto tail = this->tailIndex.load(std::memory_order_relaxed);
            auto index = this->headIndex.load(std::memory_order_relaxed);
            Block* block = nullptr;
            assert(index == tail || details::circular_less_than(index, tail));
            bool forceFreeLastBlock = index != tail;        // If we enter the loop, then the last (tail) block will not be freed
            while (index != tail) {
                if ((index & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 || block == nullptr) {
                    if (block != nullptr) {
                        // Free the old block
                        this->parent->add_block_to_free_list(block);
                    }
                    
                    block = get_block_index_entry_for_index(index)->value.load(std::memory_order_relaxed);
                }
                
                ((*block)[index])->~T();
                ++index;
            }
            // Even if the queue is empty, there's still one block that's not on the free list
            // (unless the head index reached the end of it, in which case the tail will be poised
            // to create a new block).
            if (this->tailBlock != nullptr && (forceFreeLastBlock || (tail & static_cast<index_t>(BLOCK_SIZE - 1)) != 0)) {
                this->parent->add_block_to_free_list(this->tailBlock);
            }
            
            // Destroy block index
            auto localBlockIndex = blockIndex.load(std::memory_order_relaxed);
            if (localBlockIndex != nullptr) {
                for (size_t i = 0; i != localBlockIndex->capacity; ++i) {
                    localBlockIndex->index[i]->~BlockIndexEntry();
                }
                do {
                    auto prev = localBlockIndex->prev;
                    localBlockIndex->~BlockIndexHeader();
                    (Traits::free)(localBlockIndex);
                    localBlockIndex = prev;
                } while (localBlockIndex != nullptr);
            }
        }